

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapOneofField
          (Reflection *this,Message *message1,Message *message2,OneofDescriptor *oneof_descriptor)

{
  CppType CVar1;
  long *plVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  double *pdVar6;
  bool *pbVar7;
  int *piVar8;
  LogMessage *this_00;
  Reflection *in_RSI;
  FieldDescriptor *field2;
  FieldDescriptor *field1;
  string temp_string;
  Message *temp_message;
  int temp_int;
  bool temp_bool;
  double temp_double;
  float temp_float;
  uint64 temp_uint64;
  uint32 temp_uint32;
  int64 temp_int64;
  int32 temp_int32;
  uint32 oneof_case2;
  uint32 oneof_case1;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  Reflection *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  LogLevel_conflict in_stack_fffffffffffffc7c;
  Reflection *in_stack_fffffffffffffc80;
  Message *in_stack_fffffffffffffc88;
  Reflection *in_stack_fffffffffffffc90;
  Message *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  LogMessage *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  CppType in_stack_fffffffffffffcb4;
  Reflection *in_stack_fffffffffffffce0;
  LogMessage *in_stack_fffffffffffffce8;
  Message *in_stack_fffffffffffffcf0;
  Reflection *in_stack_fffffffffffffcf8;
  int value;
  LogMessage *in_stack_fffffffffffffd00;
  string local_188 [96];
  string local_128 [32];
  LogMessage *local_108;
  string local_c0 [48];
  FieldDescriptor *local_90;
  string local_88 [32];
  Message *local_68;
  int local_60;
  byte local_59;
  double local_58;
  float local_4c;
  unsigned_long local_48;
  uint local_3c;
  long local_38;
  int local_2c;
  uint32 local_28;
  uint32 local_24;
  Reflection *local_10;
  
  local_10 = in_RSI;
  local_24 = GetOneofCase(in_stack_fffffffffffffc80,
                          (Message *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          (OneofDescriptor *)in_stack_fffffffffffffc70);
  local_28 = GetOneofCase(in_stack_fffffffffffffc80,
                          (Message *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          (OneofDescriptor *)in_stack_fffffffffffffc70);
  local_68 = (Message *)0x0;
  std::__cxx11::string::string(local_88);
  local_90 = (FieldDescriptor *)0x0;
  if (local_24 != 0) {
    local_90 = Descriptor::FindFieldByNumber
                         ((Descriptor *)
                          CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4016c8);
    switch(CVar1) {
    case CPPTYPE_INT32:
      piVar8 = GetField<int>(in_stack_fffffffffffffc70,
                             (Message *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                             (FieldDescriptor *)0x40173b);
      local_2c = *piVar8;
      break;
    case CPPTYPE_INT64:
      plVar2 = GetField<long>(in_stack_fffffffffffffc70,
                              (Message *)
                              CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                              (FieldDescriptor *)0x401778);
      local_38 = *plVar2;
      break;
    case CPPTYPE_UINT32:
      puVar3 = GetField<unsigned_int>
                         (in_stack_fffffffffffffc70,
                          (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          (FieldDescriptor *)0x4017b7);
      local_3c = *puVar3;
      break;
    case CPPTYPE_UINT64:
      puVar4 = GetField<unsigned_long>
                         (in_stack_fffffffffffffc70,
                          (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          (FieldDescriptor *)0x4017f4);
      local_48 = *puVar4;
      break;
    case CPPTYPE_DOUBLE:
      pdVar6 = GetField<double>(in_stack_fffffffffffffc70,
                                (Message *)
                                CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                (FieldDescriptor *)0x401874);
      local_58 = *pdVar6;
      break;
    case CPPTYPE_FLOAT:
      pfVar5 = GetField<float>(in_stack_fffffffffffffc70,
                               (Message *)
                               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                               (FieldDescriptor *)0x401833);
      local_4c = *pfVar5;
      break;
    case CPPTYPE_BOOL:
      pbVar7 = GetField<bool>(in_stack_fffffffffffffc70,
                              (Message *)
                              CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                              (FieldDescriptor *)0x4018b5);
      local_59 = *pbVar7 & 1;
      break;
    case CPPTYPE_ENUM:
      piVar8 = GetField<int>(in_stack_fffffffffffffc70,
                             (Message *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                             (FieldDescriptor *)0x4018f4);
      local_60 = *piVar8;
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_
                ((Reflection *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98,(FieldDescriptor *)in_stack_fffffffffffffc90);
      std::__cxx11::string::operator=(local_88,local_c0);
      std::__cxx11::string::~string(local_c0);
      break;
    case CPPTYPE_MESSAGE:
      local_68 = ReleaseMessage(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                                (FieldDescriptor *)in_stack_fffffffffffffc80,
                                (MessageFactory *)
                                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                 (char *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffc70,
                 (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      FieldDescriptor::cpp_type((FieldDescriptor *)0x4019ed);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffc70,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      internal::LogMessage::~LogMessage((LogMessage *)0x401a38);
    }
  }
  if (local_28 == 0) {
    ClearOneof((Reflection *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (Message *)in_stack_fffffffffffffca8,
               (OneofDescriptor *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  }
  else {
    local_108 = (LogMessage *)
                Descriptor::FindFieldByNumber
                          ((Descriptor *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x401aac);
    switch(CVar1) {
    case CPPTYPE_INT32:
      GetField<int>(in_stack_fffffffffffffc70,
                    (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    (FieldDescriptor *)0x401b1e);
      SetField<int>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (FieldDescriptor *)in_stack_fffffffffffffc80,
                    (int *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_INT64:
      GetField<long>(in_stack_fffffffffffffc70,
                     (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                     (FieldDescriptor *)0x401b89);
      SetField<long>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (FieldDescriptor *)in_stack_fffffffffffffc80,
                     (long *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_UINT32:
      GetField<unsigned_int>
                (in_stack_fffffffffffffc70,
                 (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (FieldDescriptor *)0x401bf4);
      SetField<unsigned_int>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (FieldDescriptor *)in_stack_fffffffffffffc80,
                 (uint *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_UINT64:
      GetField<unsigned_long>
                (in_stack_fffffffffffffc70,
                 (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (FieldDescriptor *)0x401c5f);
      SetField<unsigned_long>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (FieldDescriptor *)in_stack_fffffffffffffc80,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_DOUBLE:
      GetField<double>(in_stack_fffffffffffffc70,
                       (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       (FieldDescriptor *)0x401d35);
      SetField<double>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                       (FieldDescriptor *)in_stack_fffffffffffffc80,
                       (double *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_FLOAT:
      GetField<float>(in_stack_fffffffffffffc70,
                      (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                      (FieldDescriptor *)0x401cca);
      SetField<float>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                      (FieldDescriptor *)in_stack_fffffffffffffc80,
                      (float *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_BOOL:
      in_stack_fffffffffffffd00 = local_108;
      GetField<bool>(in_stack_fffffffffffffc70,
                     (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                     (FieldDescriptor *)0x401da0);
      SetField<bool>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (FieldDescriptor *)in_stack_fffffffffffffc80,
                     (bool *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      in_stack_fffffffffffffcf8 = local_10;
      break;
    case CPPTYPE_ENUM:
      in_stack_fffffffffffffce8 = local_108;
      in_stack_fffffffffffffcf0 =
           (Message *)
           GetField<int>(in_stack_fffffffffffffc70,
                         (Message *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                         (FieldDescriptor *)0x401e08);
      SetField<int>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (FieldDescriptor *)in_stack_fffffffffffffc80,
                    (int *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      in_stack_fffffffffffffce0 = local_10;
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_
                ((Reflection *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98,(FieldDescriptor *)in_stack_fffffffffffffc90);
      SetString(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                (FieldDescriptor *)in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_128);
      break;
    case CPPTYPE_MESSAGE:
      ReleaseMessage(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (FieldDescriptor *)in_stack_fffffffffffffc80,
                     (MessageFactory *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                    );
      SetAllocatedMessage(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                          (Message *)in_stack_fffffffffffffc80,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                 (char *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffc70,
                 (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      in_stack_fffffffffffffcb4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x401f70);
      in_stack_fffffffffffffca8 =
           internal::LogMessage::operator<<
                     (in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffc70,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      internal::LogMessage::~LogMessage((LogMessage *)0x401fac);
    }
  }
  if (local_24 == 0) {
    ClearOneof((Reflection *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (Message *)in_stack_fffffffffffffca8,
               (OneofDescriptor *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x402010);
    switch(CVar1) {
    case CPPTYPE_INT32:
      SetField<int>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (FieldDescriptor *)in_stack_fffffffffffffc80,
                    (int *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_INT64:
      SetField<long>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (FieldDescriptor *)in_stack_fffffffffffffc80,
                     (long *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_UINT32:
      SetField<unsigned_int>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (FieldDescriptor *)in_stack_fffffffffffffc80,
                 (uint *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_UINT64:
      SetField<unsigned_long>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (FieldDescriptor *)in_stack_fffffffffffffc80,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_DOUBLE:
      SetField<double>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                       (FieldDescriptor *)in_stack_fffffffffffffc80,
                       (double *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_FLOAT:
      SetField<float>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                      (FieldDescriptor *)in_stack_fffffffffffffc80,
                      (float *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_BOOL:
      SetField<bool>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (FieldDescriptor *)in_stack_fffffffffffffc80,
                     (bool *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_ENUM:
      SetField<int>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (FieldDescriptor *)in_stack_fffffffffffffc80,
                    (int *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    case CPPTYPE_STRING:
      std::__cxx11::string::string(local_188,local_88);
      SetString(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                (FieldDescriptor *)in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_188);
      break;
    case CPPTYPE_MESSAGE:
      SetAllocatedMessage(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                          (Message *)in_stack_fffffffffffffc80,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                 (char *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
      value = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffc70,
                 (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      FieldDescriptor::cpp_type((FieldDescriptor *)0x40229f);
      this_00 = internal::LogMessage::operator<<(in_stack_fffffffffffffd00,value);
      internal::LogFinisher::operator=
                ((LogFinisher *)this_00,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      internal::LogMessage::~LogMessage((LogMessage *)0x4022db);
    }
  }
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* message1, Message* message2,
                                const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = nullptr;
  std::string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = nullptr;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    // oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:           \
    temp_##TYPE = GetField<TYPE>(*message1, field1); \
    break;

      GET_TEMP_VALUE(INT32, int32);
      GET_TEMP_VALUE(INT64, int64);
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT, float);
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL, bool);
      GET_TEMP_VALUE(ENUM, int);
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 = descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
    SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
    break;

      SET_ONEOF_VALUE1(INT32, int32);
      SET_ONEOF_VALUE1(INT64, int64);
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT, float);
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL, bool);
      SET_ONEOF_VALUE1(ENUM, int);
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1, ReleaseMessage(message2, field2), field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)            \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    SetField<TYPE>(message2, field1, temp_##TYPE); \
    break;

      SET_ONEOF_VALUE2(INT32, int32);
      SET_ONEOF_VALUE2(INT64, int64);
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT, float);
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL, bool);
      SET_ONEOF_VALUE2(ENUM, int);
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}